

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmValue cVar3;
  string *psVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string_view value_00;
  string_view value_01;
  string arch;
  string tgt;
  long *local_f8;
  pointer local_f0;
  long local_e8 [2];
  string local_d8;
  undefined1 *local_b8;
  undefined8 local_b0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  string local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 local_40 [32];
  
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GHS_PRIMARY_TARGET","");
  cVar3 = cmMakefile::GetDefinition(mf,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((cVar3.Value != (string *)0x0) &&
     (value._M_str = ((cVar3.Value)->_M_dataplus)._M_p,
     value._M_len = (cVar3.Value)->_M_string_length, bVar2 = cmValue::IsOff(value), !bVar2)) {
    return true;
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"arm","");
  value_00._M_str = (p->_M_dataplus)._M_p;
  value_00._M_len = p->_M_string_length;
  bVar2 = cmValue::IsOff(value_00);
  if (!bVar2) {
    std::__cxx11::string::_M_assign((string *)&local_f8);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GHS_TARGET_PLATFORM","");
  psVar4 = (string *)cmMakefile::GetDefinition(mf,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = local_f0;
  local_d8._M_string_length = (size_type)local_f8;
  local_d8.field_2._M_allocated_capacity = 0;
  local_b8 = local_40;
  local_58 = 0;
  local_50 = 1;
  local_40[0] = 0x5f;
  local_d8.field_2._8_8_ = 1;
  local_b0 = 0;
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_a0 = (psVar4->_M_dataplus)._M_p;
  local_a8 = psVar4->_M_string_length;
  local_98 = 0;
  local_90 = 4;
  local_88 = ".tgt";
  local_80 = 0;
  views._M_len = 4;
  views._M_array = (iterator)&local_d8;
  local_48 = local_b8;
  cmCatViews(&local_78,views);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GHS_PRIMARY_TARGET","");
  value_01._M_str = local_78._M_dataplus._M_p;
  value_01._M_len = local_78._M_string_length;
  cmMakefile::AddDefinition(mf,&local_d8,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (t.IsOff()) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}